

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase476::TestCase476(TestCase476 *this)

{
  TestCase476 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x1dc,"legacy test: DynamicApi/BuilderAssign");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00cc01a8;
  return;
}

Assistant:

TEST(DynamicApi, BuilderAssign) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  // Declare upfront, assign later.
  // Note that the Python implementation requires defaulted constructors.  Do not delete them!
  DynamicValue::Builder value;
  DynamicStruct::Builder structValue;
  DynamicList::Builder listValue;

  value = root.get("structField");
  structValue = value.as<DynamicStruct>();
  structValue.set("int32Field", 123);

  value = root.init("int32List", 1);
  listValue = value.as<DynamicList>();
  listValue.set(0, 123);
}